

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::parseStateVariables(Parser *this,ScannedTopLevelItem *item)

{
  char *pcVar1;
  pointer pUVar2;
  iterator __begin3;
  pointer pUVar3;
  
  (this->module).object = item->module;
  pcVar1 = (item->moduleStartPos).data;
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).input.data != pcVar1) {
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    ).input.data = pcVar1;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
  }
  pUVar2 = (item->stateVariableDecls).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pUVar3 = (item->stateVariableDecls).
                super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                super__Vector_impl_data._M_start; pUVar3 != pUVar2; pUVar3 = pUVar3 + 1) {
    if ((this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ).input.data != pUVar3->data) {
      (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).input.data = pUVar3->data;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
    }
    parseStateVariable(this);
  }
  (this->module).object = (Module *)0x0;
  return;
}

Assistant:

void parseStateVariables (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);

        if (! item.stateVariableDecls.empty())
        {
            for (auto& g : item.stateVariableDecls)
            {
                resetPosition (g);
                parseStateVariable();
            }
        }

        module.reset();
    }